

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImStb::stb_textedit_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,ImWchar *text,int text_len)

{
  bool bVar1;
  ImGuiID in_ECX;
  STB_TexteditState *in_RDX;
  ImGuiInputTextState *in_RSI;
  ImWchar *in_RDI;
  int unaff_retaddr;
  undefined4 in_stack_00000008;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  stb_text_makeundo_replace
            (in_RSI,in_RDX,in_ECX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  STB_TEXTEDIT_DELETECHARS(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  if ((0 < (int)in_ECX) &&
     (bVar1 = STB_TEXTEDIT_INSERTCHARS
                        ((ImGuiInputTextState *)CONCAT44(text_len,in_stack_00000008),unaff_retaddr,
                         in_RDI,(int)((ulong)in_RSI >> 0x20)), bVar1)) {
    in_RSI->ID = in_ECX;
    *(undefined1 *)((long)&(in_RSI->TextW).Capacity + 2) = 0;
  }
  return;
}

Assistant:

static void stb_textedit_replace(ImGuiInputTextState* str, STB_TexteditState* state, const STB_TEXTEDIT_CHARTYPE* text, int text_len)
{
    stb_text_makeundo_replace(str, state, 0, str->CurLenW, text_len);
    ImStb::STB_TEXTEDIT_DELETECHARS(str, 0, str->CurLenW);
    if (text_len <= 0)
        return;
    if (ImStb::STB_TEXTEDIT_INSERTCHARS(str, 0, text, text_len))
    {
        state->cursor = text_len;
        state->has_preferred_x = 0;
        return;
    }
    IM_ASSERT(0); // Failed to insert character, normally shouldn't happen because of how we currently use stb_textedit_replace()
}